

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessfilebackend.cpp
# Opt level: O1

int __thiscall
QNetworkAccessFileBackend::open(QNetworkAccessFileBackend *this,char *__file,int __oflag,...)

{
  QNetworkAccessFileBackend *pQVar1;
  int iVar2;
  QArrayData *pQVar3;
  Data *pDVar4;
  qsizetype qVar5;
  QArrayData *pQVar6;
  QArrayData *pQVar7;
  char16_t *pcVar8;
  QArrayData *pQVar9;
  QArrayData *pQVar10;
  char16_t *pcVar11;
  char cVar12;
  bool bVar13;
  char cVar14;
  Operation OVar15;
  QIODevice *pQVar16;
  undefined4 *puVar17;
  NetworkError code;
  undefined8 uVar18;
  long in_FS_OFFSET;
  QStringView QVar19;
  QAnyStringView QVar20;
  QByteArrayView QVar21;
  QStringView QVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  QString local_e8;
  QUrl local_d0;
  QObject local_c8 [8];
  QObject local_c0 [8];
  QString local_b8;
  QString local_98;
  QArrayData *local_78;
  QArrayData *pQStack_70;
  char16_t *local_68;
  QUrl url;
  QStringBuilder<char16_t,_QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkAccessBackend::url((QNetworkAccessBackend *)&url);
  QUrl::host(&local_58,(QNetworkAccessBackend *)&url,0x7f00000);
  if (local_58.b.d.ptr == (char16_t *)0x9) {
    QVar19.m_data = (storage_type_conflict *)local_58.b.d.d;
    QVar19.m_size = 9;
    QVar23.m_data = "localhost";
    QVar23.m_size = 9;
    cVar12 = QtPrivate::equalStrings(QVar19,QVar23);
  }
  else {
    cVar12 = '\0';
  }
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  if (cVar12 != '\0') {
    local_58._0_8_ = (QArrayData *)0x0;
    local_58.b.d.d = (Data *)0x0;
    local_58.b.d.ptr = (char16_t *)0x0;
    QUrl::setHost((QString *)&url,(ParsingMode)&local_58);
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
  }
  QUrl::host(&local_58,&url,0x7f00000);
  pcVar8 = local_58.b.d.ptr;
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  if (pcVar8 != (char16_t *)0x0) {
    QCoreApplication::translate
              ((char *)&local_78,"QNetworkAccessFileBackend","Request for opening non-local file %1"
               ,0);
    QUrl::toString(&local_98,&url,0);
    QVar20.m_size = (size_t)&local_78;
    QVar20.field_0.m_data = &local_58;
    QString::arg_impl(QVar20,(int)local_98.d.ptr,(QChar)(char16_t)local_98.d.size);
    QNetworkAccessBackend::error
              ((QNetworkAccessBackend *)this,ProtocolInvalidOperationError,(QString *)&local_58);
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
    goto LAB_0017df84;
  }
  QUrl::path(&local_58,&url,0x7f00000);
  pcVar8 = local_58.b.d.ptr;
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  if (pcVar8 == (char16_t *)0x0) {
    QVar21.m_data = (storage_type *)0x1;
    QVar21.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar21);
    local_78 = (QArrayData *)local_58._0_8_;
    pQStack_70 = &(local_58.b.d.d)->super_QArrayData;
    local_68 = local_58.b.d.ptr;
    QUrl::setPath((QString *)&url,(ParsingMode)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
  }
  QNetworkAccessBackend::setUrl((QNetworkAccessBackend *)this,&url);
  local_68 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::toLocalFile();
  pQVar6 = local_78;
  pQVar7 = pQStack_70;
  pcVar8 = local_68;
  pQVar9 = (QArrayData *)local_58._0_8_;
  pQVar10 = &(local_58.b.d.d)->super_QArrayData;
  pcVar11 = local_58.b.d.ptr;
  if (local_68 == (char16_t *)0x0) {
    QUrl::scheme();
    if (local_58.b.d.ptr == (char16_t *)0x3) {
      QVar22.m_data = (storage_type_conflict *)local_58.b.d.d;
      QVar22.m_size = 3;
      QVar24.m_data = "qrc";
      QVar24.m_size = 3;
      cVar12 = QtPrivate::equalStrings(QVar22,QVar24);
    }
    else {
      cVar12 = '\0';
    }
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
    if (cVar12 == '\0') {
      QUrl::toString(&local_58,&url,0xde);
      pQVar6 = (QArrayData *)local_58._0_8_;
      pQVar7 = &(local_58.b.d.d)->super_QArrayData;
      pcVar8 = local_58.b.d.ptr;
      pQVar9 = local_78;
      pQVar10 = pQStack_70;
      pcVar11 = local_68;
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        iVar2 = (local_78->ref_)._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        pQVar6 = local_78;
        pQVar7 = (QArrayData *)local_58._0_8_;
        pQVar9 = &(local_58.b.d.d)->super_QArrayData;
        local_58.b.d.d = (Data *)pQStack_70;
        pcVar8 = local_68;
        local_68 = local_58.b.d.ptr;
        pQVar3 = local_78;
        goto joined_r0x0017e55a;
      }
    }
    else {
      QUrl::path(&local_b8,&url,0x7f00000);
      local_58.b.d.size = local_b8.d.size;
      local_58.b.d.ptr = local_b8.d.ptr;
      local_58.b.d.d = local_b8.d.d;
      local_58.a = 0x3a;
      local_b8.d.d = (Data *)0x0;
      local_b8.d.ptr = (char16_t *)0x0;
      local_b8.d.size = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>(&local_98,&local_58);
      pQVar7 = pQStack_70;
      pQVar6 = local_78;
      qVar5 = local_98.d.size;
      pDVar4 = local_98.d.d;
      local_98.d.d = (Data *)local_78;
      local_78 = &pDVar4->super_QArrayData;
      pQStack_70 = (QArrayData *)local_98.d.ptr;
      local_98.d.ptr = (char16_t *)pQVar7;
      local_98.d.size = (qsizetype)local_68;
      local_68 = (char16_t *)qVar5;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,2,0x10);
        }
      }
      if (&(local_58.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar6 = local_78;
      pQVar7 = pQStack_70;
      pcVar8 = local_68;
      pQVar9 = (QArrayData *)local_58._0_8_;
      pQVar10 = &(local_58.b.d.d)->super_QArrayData;
      pcVar11 = local_58.b.d.ptr;
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        iVar2 = ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        pQVar6 = (QArrayData *)local_58._0_8_;
        pQVar7 = local_78;
        pQVar9 = pQStack_70;
        pcVar8 = local_58.b.d.ptr;
        pQVar3 = &(local_b8.d.d)->super_QArrayData;
joined_r0x0017e55a:
        local_58.b.d.ptr = pcVar8;
        pQStack_70 = pQVar9;
        local_78 = pQVar7;
        local_58._0_8_ = pQVar6;
        pQVar6 = local_78;
        pQVar7 = pQStack_70;
        pcVar8 = local_68;
        pQVar9 = (QArrayData *)local_58._0_8_;
        pQVar10 = &(local_58.b.d.d)->super_QArrayData;
        pcVar11 = local_58.b.d.ptr;
        if (iVar2 == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
          pQVar6 = local_78;
          pQVar7 = pQStack_70;
          pcVar8 = local_68;
          pQVar9 = (QArrayData *)local_58._0_8_;
          pQVar10 = &(local_58.b.d.d)->super_QArrayData;
          pcVar11 = local_58.b.d.ptr;
        }
      }
    }
  }
  local_58.b.d.ptr = pcVar11;
  local_58.b.d.d = (Data *)pQVar10;
  local_58._0_8_ = pQVar9;
  local_68 = pcVar8;
  pQStack_70 = pQVar7;
  local_78 = pQVar6;
  pQVar1 = this + 0x10;
  QFile::setFileName((QString *)pQVar1);
  OVar15 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)this);
  if ((OVar15 != GetOperation) || (bVar13 = loadFileInfo(this), bVar13)) {
    OVar15 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)this);
    if (OVar15 == GetOperation) {
      uVar18 = 0x21;
    }
    else {
      if (OVar15 != PutOperation) goto LAB_0017e3c7;
      QNetworkAccessBackend::createUploadByteDevice((QNetworkAccessBackend *)this);
      pQVar16 = QNetworkAccessBackend::uploadByteDevice((QNetworkAccessBackend *)this);
      QObject::connect(local_c0,(char *)pQVar16,(QObject *)"2readyRead()",(char *)this,0x25e6f1);
      QMetaObject::Connection::~Connection((Connection *)local_c0);
      local_58._0_8_ = (QArrayData *)0x0;
      local_58.b.d.d = (Data *)0x0;
      local_58.b.d.ptr = (char16_t *)0x0;
      QMetaObject::invokeMethodImpl
                ((QObject *)this,"uploadReadyReadSlot",QueuedConnection,1,(void **)&local_58,
                 (char **)&local_58.b,(QMetaTypeInterface **)&local_58.b.d.ptr);
      uVar18 = 0x2a;
    }
    cVar12 = QFile::open(pQVar1,uVar18);
    cVar14 = QFileDevice::isSequential();
    if (cVar14 != '\0') {
      local_58._0_8_ = QIODevice::readChannelFinished;
      local_58.b.d.d = (Data *)0x0;
      puVar17 = (undefined4 *)operator_new(0x18);
      *puVar17 = 1;
      *(code **)(puVar17 + 2) =
           QtPrivate::
           QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qnetworkaccessfilebackend.cpp:137:63),_QtPrivate::List<>,_void>
           ::impl;
      *(QNetworkAccessFileBackend **)(puVar17 + 4) = this;
      QObject::connectImpl
                (local_c8,(void **)pQVar1,(QObject *)&local_58,(void **)this,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar17,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_c8);
    }
    if (cVar12 == '\0') {
      local_58.b.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QCoreApplication::translate
                ((char *)&local_98,"QNetworkAccessFileBackend","Error opening %1: %2",0);
      QNetworkAccessBackend::url((QNetworkAccessBackend *)&local_d0);
      QUrl::toString(&local_b8,(QNetworkAccessBackend *)&local_d0,0);
      QIODevice::errorString();
      QString::arg<QString,QString>((type *)&local_58,&local_98,&local_b8,&local_e8);
      if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QUrl::~QUrl(&local_d0);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      cVar12 = QFile::exists();
      code = ContentAccessDenied;
      if (cVar12 == '\0') {
        OVar15 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)this);
        code = (uint)(OVar15 != PutOperation) * 2 + ContentAccessDenied;
      }
      QNetworkAccessBackend::error((QNetworkAccessBackend *)this,code,(QString *)&local_58);
      QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
      if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
        }
      }
    }
  }
LAB_0017e3c7:
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,0x10);
    }
  }
LAB_0017df84:
  QUrl::~QUrl(&url);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessFileBackend::open()
{
    QUrl url = this->url();

    if (url.host() == "localhost"_L1)
        url.setHost(QString());
#if !defined(Q_OS_WIN)
    // do not allow UNC paths on Unix
    if (!url.host().isEmpty()) {
        // we handle only local files
        error(QNetworkReply::ProtocolInvalidOperationError,
              QCoreApplication::translate("QNetworkAccessFileBackend", "Request for opening non-local file %1").arg(url.toString()));
        finished();
        return;
    }
#endif // !defined(Q_OS_WIN)
    if (url.path().isEmpty())
        url.setPath("/"_L1);
    setUrl(url);

    QString fileName = url.toLocalFile();
    if (fileName.isEmpty()) {
        if (url.scheme() == "qrc"_L1) {
            fileName = u':' + url.path();
        } else {
#if defined(Q_OS_ANDROID)
            if (url.scheme() == "assets"_L1)
                fileName = "assets:"_L1 + url.path();
            else
#endif
                fileName = url.toString(QUrl::RemoveAuthority | QUrl::RemoveFragment | QUrl::RemoveQuery);
        }
    }
    file.setFileName(fileName);

    if (operation() == QNetworkAccessManager::GetOperation) {
        if (!loadFileInfo())
            return;
    }

    QIODevice::OpenMode mode;
    switch (operation()) {
    case QNetworkAccessManager::GetOperation:
        mode = QIODevice::ReadOnly;
        break;
    case QNetworkAccessManager::PutOperation:
        mode = QIODevice::WriteOnly | QIODevice::Truncate;
        createUploadByteDevice();
        QObject::connect(uploadByteDevice(), SIGNAL(readyRead()), this, SLOT(uploadReadyReadSlot()));
        QMetaObject::invokeMethod(this, "uploadReadyReadSlot", Qt::QueuedConnection);
        break;
    default:
        Q_ASSERT_X(false, "QNetworkAccessFileBackend::open",
                   "Got a request operation I cannot handle!!");
        return;
    }

    mode |= QIODevice::Unbuffered;
    bool opened = file.open(mode);
    if (file.isSequential())
        connect(&file, &QIODevice::readChannelFinished, this, [this]() { finished(); });

    // could we open the file?
    if (!opened) {
        QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Error opening %1: %2")
                                                .arg(this->url().toString(), file.errorString());

        // why couldn't we open the file?
        // if we're opening for reading, either it doesn't exist, or it's access denied
        // if we're opening for writing, not existing means it's access denied too
        if (file.exists() || operation() == QNetworkAccessManager::PutOperation)
            error(QNetworkReply::ContentAccessDenied, msg);
        else
            error(QNetworkReply::ContentNotFoundError, msg);
        finished();
    }
}